

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O3

void __thiscall
MapIRCCommand::trigger
          (MapIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  char cVar1;
  long lVar2;
  char *pcVar3;
  size_t sVar4;
  bool bVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3;
  undefined8 *puVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string_view<char,_std::char_traits<char>_> local_88;
  long local_78 [2];
  undefined8 *local_68;
  undefined8 *local_60;
  long local_58;
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  
  args_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)nick._M_str;
  pcVar3 = channel._M_str;
  sVar4 = channel._M_len;
  lVar2 = Jupiter::IRC::Client::getChannel(source,sVar4,pcVar3,pcVar3,nick._M_len);
  if (lVar2 != 0) {
    Jupiter::IRC::Client::Channel::getType();
    RenX::getCore();
    RenX::Core::getServers();
    if (local_68 == local_60) {
      bVar5 = true;
    }
    else {
      bVar5 = false;
      puVar6 = local_68;
      do {
        cVar1 = RenX::Server::isLogChanType((int)*puVar6);
        if (cVar1 != '\0') {
          lVar2 = RenX::Server::getMap();
          local_40._0_8_ = 0xd;
          local_40._8_8_ = "Current Map: ";
          local_50._0_8_ = (pointer)0x8;
          local_50._8_8_ = "; GUID: ";
          RenX::formatGUID_abi_cxx11_((Map *)&local_88);
          jessilib::
          join<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
                    (&local_a8,(jessilib *)local_40,
                     (basic_string_view<char,_std::char_traits<char>_> *)(lVar2 + 0x10),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                     &local_88,args_3);
          Jupiter::IRC::Client::sendMessage
                    (source,sVar4,pcVar3,local_a8._M_string_length,local_a8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
          }
          if ((long *)local_88._M_len != local_78) {
            operator_delete((void *)local_88._M_len,local_78[0] + 1);
          }
          bVar5 = true;
        }
        puVar6 = puVar6 + 1;
      } while (puVar6 != local_60);
      bVar5 = !bVar5;
    }
    if (local_68 != (undefined8 *)0x0) {
      operator_delete(local_68,local_58 - (long)local_68);
    }
    if (bVar5) {
      Jupiter::IRC::Client::sendMessage
                (source,sVar4,pcVar3,0x40,
                 "Error: Channel not attached to any connected Renegade X servers.");
    }
  }
  return;
}

Assistant:

void MapIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters) {
	Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
	if (chan != nullptr) {
		int type = chan->getType();
		bool match = false;
		for (const auto& server : RenX::getCore()->getServers()) {
			if (server->isLogChanType(type)) {
				match = true;
				const RenX::Map &map = server->getMap();
				source->sendMessage(channel, jessilib::join<std::string>("Current Map: "sv, map.name, "; GUID: "sv, RenX::formatGUID(map)));
			}
		}
		if (match == false) {
			source->sendMessage(channel, "Error: Channel not attached to any connected Renegade X servers."sv);
		}
	}
}